

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>(longdouble x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int extraout_var;
  double __value;
  dummy_int local_30;
  undefined1 auStack_28 [8];
  longdouble x_local;
  bool local_9;
  
  _auStack_28 = x;
  bVar1 = fmt::v5::internal::const_check<bool>(true);
  if (bVar1) {
    uVar2 = isinf(__value);
    local_9 = (uVar2 & 1) != 0;
  }
  else {
    local_30.data[0] = fmt::v5::internal::_finite((double)_auStack_28);
    local_30.data[1] = extraout_var;
    iVar3 = fmt::v5::internal::dummy_int::operator_cast_to_int(&local_30);
    local_9 = iVar3 == 0;
  }
  return local_9;
}

Assistant:

static bool isinfinity(T x) {
    using namespace fmt::internal;
    // The resolution "priority" is:
    // isinf macro > std::isinf > ::isinf > fmt::internal::isinf
    if (const_check(sizeof(isinf(x)) != sizeof(dummy_int)))
      return isinf(x) != 0;
    return !_finite(static_cast<double>(x));
  }